

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacketBuilder::Report::~Report(Report *this)

{
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__Report_0014dd38;
  Clear(this);
  std::__cxx11::
  _List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::_M_clear(&(this->reportblocks).
              super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
            );
  return;
}

Assistant:

~Report() { Clear(); }